

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# switches.cpp
# Opt level: O2

pair<switches,_int> *
get_switches(pair<switches,_int> *__return_storage_ptr__,int argc,tchar **argv)

{
  allocator local_61;
  undefined1 local_60 [32];
  _Alloc_hider local_40;
  size_type local_38;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_30;
  uint local_20;
  bool local_1c;
  
  std::__cxx11::string::string((string *)local_60,"pstore read utility\n",&local_61);
  pstore::command_line::parse_command_line_options(argc,argv,(string *)local_60);
  std::__cxx11::string::~string((string *)local_60);
  local_60._0_8_ = local_60 + 0x10;
  local_60._8_8_ = 0;
  local_60[0x10] = '\0';
  local_40._M_p = (pointer)&local_30;
  local_38 = 0;
  local_30._M_local_buf[0] = '\0';
  local_1c = false;
  local_20 = (anonymous_namespace)::revision_abi_cxx11_._136_4_;
  std::__cxx11::string::_M_assign((string *)local_60);
  std::__cxx11::string::_M_assign((string *)&local_40);
  local_1c = (bool)(anonymous_namespace)::string_mode[0x88];
  switches::switches(&__return_storage_ptr__->first,(switches *)local_60);
  __return_storage_ptr__->second = 0;
  switches::~switches((switches *)local_60);
  return __return_storage_ptr__;
}

Assistant:

std::pair<switches, int> get_switches (int argc, tchar * argv[]) {
    parse_command_line_options (argc, argv, "pstore read utility\n");

    switches result;
    result.revision = static_cast<unsigned> (revision.get ());
    result.db_path = db_path.get ();
    result.key = key.get ();
    result.string_mode = string_mode.get ();

    return {result, EXIT_SUCCESS};
}